

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

void __thiscall wabt::ReturnCallIndirectExpr::~ReturnCallIndirectExpr(ReturnCallIndirectExpr *this)

{
  ReturnCallIndirectExpr *this_local;
  
  (this->super_ExprMixin<(wabt::ExprType)40>).super_Expr._vptr_Expr =
       (_func_int **)&PTR__ReturnCallIndirectExpr_0036ba58;
  Var::~Var(&this->table);
  FuncDeclaration::~FuncDeclaration(&this->decl);
  ExprMixin<(wabt::ExprType)40>::~ExprMixin(&this->super_ExprMixin<(wabt::ExprType)40>);
  return;
}

Assistant:

explicit ReturnCallIndirectExpr(const Location &loc = Location())
      : ExprMixin<ExprType::ReturnCallIndirect>(loc) {}